

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_linpart.cpp
# Opt level: O2

Remotes * Omega_h::globals_to_linear_owners
                    (Remotes *__return_storage_ptr__,Read<long> *globals,GO total,I32 comm_size)

{
  Alloc *pAVar1;
  int iVar2;
  long lVar3;
  undefined4 uVar4;
  long lVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_181;
  undefined1 local_180 [32];
  long local_160;
  long local_158;
  Write<int> local_150;
  GO local_140;
  Write<int> idxs;
  Write<int> ranks;
  Write<int> local_118;
  Write<int> local_108;
  Write<int> local_f8;
  Write<int> local_e8;
  type f;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar3 = total / (long)comm_size;
  lVar5 = total % (long)comm_size;
  pAVar1 = (globals->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar7 = pAVar1->size;
  }
  else {
    sVar7 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)local_180,"",(allocator *)&f);
  Write<int>::Write(&ranks,(LO)(sVar7 >> 3),(string *)local_180);
  std::__cxx11::string::~string((string *)local_180);
  pAVar1 = (globals->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar7 = pAVar1->size;
  }
  else {
    sVar7 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)local_180,"",(allocator *)&f);
  Write<int>::Write(&idxs,(LO)(sVar7 >> 3),(string *)local_180);
  std::__cxx11::string::~string((string *)local_180);
  Write<long>::Write((Write<int> *)&f,(Write<int> *)globals);
  f.split = (lVar3 + 1) * lVar5;
  Write<int>::Write(&f.ranks,&ranks);
  f.quot = lVar3;
  Write<int>::Write(&f.idxs,&idxs);
  pAVar1 = (globals->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar7 = pAVar1->size;
  }
  else {
    sVar7 = (ulong)pAVar1 >> 3;
  }
  f.rem = lVar5;
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,&local_181);
  std::operator+(&local_50,&local_70,":");
  std::__cxx11::to_string(&local_90,0x54);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                 &local_50,&local_90);
  begin_code("parallel_for",(char *)local_180._0_8_);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  uVar6 = (uint)(sVar7 >> 3);
  if (0 < (int)uVar6) {
    entering_parallel = 1;
    Write<long>::Write((Write<int> *)local_180,(Write<int> *)&f);
    local_180._16_8_ = f.split;
    Write<int>::Write((Write<int> *)(local_180 + 0x18),&f.ranks);
    local_158 = f.quot;
    Write<int>::Write(&local_150,&f.idxs);
    local_140 = f.rem;
    entering_parallel = 0;
    for (uVar8 = 0; (uVar6 & 0x7fffffff) != uVar8; uVar8 = uVar8 + 1) {
      lVar3 = *(long *)(local_180._8_8_ + uVar8 * 8);
      if (lVar3 < (long)local_180._16_8_) {
        iVar2 = (int)(lVar3 / (local_158 + 1));
        uVar4 = (undefined4)(lVar3 % (local_158 + 1));
      }
      else {
        uVar4 = (undefined4)((lVar3 - local_180._16_8_) % local_158);
        iVar2 = (int)((lVar3 - local_180._16_8_) / local_158) + (int)f.rem;
      }
      *(int *)(local_160 + uVar8 * 4) = iVar2;
      *(undefined4 *)((long)local_150.shared_alloc_.direct_ptr + uVar8 * 4) = uVar4;
    }
    globals_to_linear_owners(Omega_h::Read<long>,long,int)::$_0::~__0((__0 *)local_180);
  }
  ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
  Write<int>::Write(&local_f8,&ranks);
  Read<int>::Read((Read<signed_char> *)&local_e8,&local_f8);
  Write<int>::Write(&local_118,&idxs);
  Read<int>::Read((Read<signed_char> *)&local_108,&local_118);
  Remotes::Remotes(__return_storage_ptr__,(Read<int> *)&local_e8,(LOs *)&local_108);
  Write<int>::~Write(&local_108);
  Write<int>::~Write(&local_118);
  Write<int>::~Write(&local_e8);
  Write<int>::~Write(&local_f8);
  globals_to_linear_owners(Omega_h::Read<long>,long,int)::$_0::~__0((__0 *)&f);
  Write<int>::~Write(&idxs);
  Write<int>::~Write(&ranks);
  return __return_storage_ptr__;
}

Assistant:

Remotes globals_to_linear_owners(Read<GO> globals, GO total, I32 comm_size) {
  auto const comm_size_gt = GO(comm_size);
  auto const quot = total / comm_size_gt;
  auto const rem = total % comm_size_gt;
  auto const split = ((quot + 1) * rem);
  Write<I32> ranks(globals.size());
  Write<LO> idxs(globals.size());
  auto f = OMEGA_H_LAMBDA(LO i) {
    if (globals[i] < split) {
      ranks[i] = static_cast<I32>(globals[i] / (quot + 1));
      idxs[i] = static_cast<LO>(globals[i] % (quot + 1));
    } else {
      auto const g = globals[i] - split;
      ranks[i] = static_cast<I32>(g / quot + rem);
      idxs[i] = static_cast<LO>(g % quot);
    }
  };
  parallel_for(globals.size(), std::move(f));
  return Remotes(ranks, idxs);
}